

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

int __thiscall QDockWidgetLayout::titleHeight(QDockWidgetLayout *this)

{
  char cVar1;
  QLayoutItem *pQVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  QWidget *this_00;
  undefined4 extraout_var;
  ulong uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar8;
  QStyle *pQVar9;
  undefined8 uVar10;
  int unaff_R15D;
  int iVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QFontMetrics titleFontMetrics;
  undefined1 *local_40;
  long local_38;
  long *plVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
  pQVar2 = (this->item_list).d.ptr[3];
  if (pQVar2 == (QLayoutItem *)0x0) {
    plVar6 = (long *)0x0;
  }
  else {
    iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
    plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  }
  if (plVar6 != (long *)0x0) {
    cVar1 = (this->super_QLayout).super_QLayoutItem.field_0xc;
    uVar7 = (**(code **)(*plVar6 + 0x70))(plVar6);
    uVar3 = uVar7 >> 0x20;
    if (cVar1 != '\0') {
      uVar3 = uVar7;
    }
    unaff_R15D = (int)uVar3;
  }
  if (plVar6 == (long *)0x0) {
    pQVar2 = (this->item_list).d.ptr[1];
    uVar8 = 0;
    uVar10 = 0;
    iVar4 = 0;
    if (pQVar2 != (QLayoutItem *)0x0) {
      iVar4 = (*pQVar2->_vptr_QLayoutItem[0xd])();
      uVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x70))
                         ((long *)CONCAT44(extraout_var_00,iVar4));
      iVar4 = (int)((ulong)uVar10 >> 0x20);
    }
    pQVar2 = (this->item_list).d.ptr[2];
    iVar5 = 0;
    if (pQVar2 != (QLayoutItem *)0x0) {
      iVar5 = (*pQVar2->_vptr_QLayoutItem[0xd])();
      uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x70))
                        ((long *)CONCAT44(extraout_var_01,iVar5));
      iVar5 = (int)((ulong)uVar8 >> 0x20);
    }
    bVar12 = (this->super_QLayout).super_QLayoutItem.field_0xc != '\0';
    if (bVar12) {
      iVar4 = (int)uVar10;
    }
    iVar11 = (int)uVar8;
    if (!bVar12) {
      iVar11 = iVar5;
    }
    if (iVar11 < iVar4) {
      iVar11 = iVar4;
    }
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_40,&this_00->data->fnt);
    pQVar9 = QWidget::style(this_00);
    iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x46,0,this_00);
    iVar5 = QFontMetrics::height();
    iVar5 = iVar5 + iVar4 * 2;
    unaff_R15D = iVar11 + 2;
    if (iVar11 + 2 <= iVar5) {
      unaff_R15D = iVar5;
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return unaff_R15D;
  }
  __stack_chk_fail();
}

Assistant:

int QDockWidgetLayout::titleHeight() const
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    if (QWidget *title = widgetForRole(TitleBar))
        return perp(verticalTitleBar, title->sizeHint());

    QSize closeSize(0, 0);
    QSize floatSize(0, 0);
    if (QLayoutItem *item = item_list[CloseButton])
        closeSize = item->widget()->sizeHint();
    if (QLayoutItem *item = item_list[FloatButton])
        floatSize = item->widget()->sizeHint();

    int buttonHeight = qMax(perp(verticalTitleBar, closeSize),
                            perp(verticalTitleBar, floatSize));

    QFontMetrics titleFontMetrics = q->fontMetrics();
    int mw = q->style()->pixelMetric(QStyle::PM_DockWidgetTitleMargin, nullptr, q);

    return qMax(buttonHeight + 2, titleFontMetrics.height() + 2*mw);
}